

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

nn_list_item * nn_list_erase(nn_list *self,nn_list_item *item)

{
  nn_list_item *pnVar1;
  int iVar2;
  nn_list_item *in_RSI;
  undefined8 *in_RDI;
  nn_list_item *next;
  
  iVar2 = nn_list_item_isinlist(in_RSI);
  if (iVar2 == 0) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","nn_list_item_isinlist (item)",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/utils/list.c"
            ,0x5e);
    fflush(_stderr);
    nn_err_abort();
  }
  if (in_RSI->prev == (nn_list_item *)0x0) {
    *in_RDI = in_RSI->next;
  }
  else {
    in_RSI->prev->next = in_RSI->next;
  }
  if (in_RSI->next == (nn_list_item *)0x0) {
    in_RDI[1] = in_RSI->prev;
  }
  else {
    in_RSI->next->prev = in_RSI->prev;
  }
  pnVar1 = in_RSI->next;
  in_RSI->prev = (nn_list_item *)0xffffffffffffffff;
  in_RSI->next = (nn_list_item *)0xffffffffffffffff;
  return pnVar1;
}

Assistant:

struct nn_list_item *nn_list_erase (struct nn_list *self,
    struct nn_list_item *item)
{
    struct nn_list_item *next;

    nn_assert (nn_list_item_isinlist (item));

    if (item->prev)
        item->prev->next = item->next;
    else
        self->first = item->next;
    if (item->next)
        item->next->prev = item->prev;
    else
        self->last = item->prev;

    next = item->next;

    item->prev = NN_LIST_NOTINLIST;
    item->next = NN_LIST_NOTINLIST;

    return next;
}